

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
PvrLegacyHeader::ToStringArray_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PvrLegacyHeader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char cVar4;
  char cVar5;
  long lVar6;
  uint uVar7;
  uint flags;
  long lVar8;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  string magic_number_string;
  string num_surfaces_string;
  string __str_4;
  string pixel_format_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  value_type local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (PvrLegacyInfo::pixel_format_names_abi_cxx11_._16_8_ == 0) {
    lVar8 = 0x1431f0;
  }
  else {
    lVar6 = 0x1431f0;
    lVar8 = PvrLegacyInfo::pixel_format_names_abi_cxx11_._16_8_;
    do {
      uVar9 = (uint)(byte)(this->impl_v1_).pixel_format_flags;
      bVar12 = *(uint *)(lVar8 + 0x20) < uVar9;
      if (!bVar12) {
        lVar6 = lVar8;
      }
      lVar8 = *(long *)(lVar8 + 0x10 + (ulong)bVar12 * 8);
    } while (lVar8 != 0);
    lVar8 = 0x1431f0;
    if ((lVar6 != 0x1431f0) && (lVar8 = 0x1431f0, *(uint *)(lVar6 + 0x20) <= uVar9)) {
      lVar8 = lVar6;
    }
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,*(long *)(lVar8 + 0x28),
             *(long *)(lVar8 + 0x30) + *(long *)(lVar8 + 0x28));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_50);
  uVar9 = (this->impl_v1_).bit_count;
  cVar5 = '\x01';
  if (9 < uVar9) {
    uVar7 = uVar9;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar7 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0012dcd2;
      }
      if (uVar7 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0012dcd2;
      }
      if (uVar7 < 10000) goto LAB_0012dcd2;
      bVar12 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar12);
    cVar5 = cVar5 + '\x01';
  }
LAB_0012dcd2:
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  uVar9 = (this->impl_v1_).width;
  cVar5 = '\x01';
  if (9 < uVar9) {
    uVar7 = uVar9;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar7 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0012dd68;
      }
      if (uVar7 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0012dd68;
      }
      if (uVar7 < 10000) goto LAB_0012dd68;
      bVar12 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar12);
    cVar5 = cVar5 + '\x01';
  }
LAB_0012dd68:
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  uVar9 = (this->impl_v1_).height;
  cVar5 = '\x01';
  if (9 < uVar9) {
    uVar7 = uVar9;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar7 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0012ddf8;
      }
      if (uVar7 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0012ddf8;
      }
      if (uVar7 < 10000) goto LAB_0012ddf8;
      bVar12 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar12);
    cVar5 = cVar5 + '\x01';
  }
LAB_0012ddf8:
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  uVar9 = (this->impl_v2_).num_surfaces;
  if (uVar9 == 0) {
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"-","");
  }
  else {
    cVar5 = '\x01';
    if (9 < uVar9) {
      uVar7 = uVar9;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar7 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_0012dea9;
        }
        if (uVar7 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_0012dea9;
        }
        if (uVar7 < 10000) goto LAB_0012dea9;
        bVar12 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar12);
      cVar5 = cVar5 + '\x01';
    }
LAB_0012dea9:
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_90,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar9);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_90);
  uVar9 = (this->impl_v1_).mip_map_count + 1;
  cVar5 = '\x01';
  if (9 < uVar9) {
    uVar7 = uVar9;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar7 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0012df2b;
      }
      if (uVar7 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0012df2b;
      }
      if (uVar7 < 10000) goto LAB_0012df2b;
      bVar12 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar12);
    cVar5 = cVar5 + '\x01';
  }
LAB_0012df2b:
  paVar2 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&local_b0,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_b0._M_dataplus._M_p,(uint)local_b0._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  bVar12 = (this->impl_v1_).red_mask == 0;
  pcVar11 = "True";
  pcVar10 = "True";
  if (bVar12) {
    pcVar10 = "False";
  }
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,pcVar10,pcVar10 + (ulong)bVar12 + 4);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  bVar12 = (this->impl_v1_).green_mask == 0;
  pcVar10 = "True";
  if (bVar12) {
    pcVar10 = "False";
  }
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,pcVar10,pcVar10 + (ulong)bVar12 + 4);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  bVar12 = (this->impl_v1_).blue_mask == 0;
  pcVar10 = "True";
  if (bVar12) {
    pcVar10 = "False";
  }
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,pcVar10,pcVar10 + (ulong)bVar12 + 4);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  bVar12 = (this->impl_v1_).alpha_mask == 0;
  if (bVar12) {
    pcVar11 = "False";
  }
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,pcVar11,pcVar11 + (ulong)bVar12 + 4);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  uVar9 = (this->impl_v2_).magic_number;
  if (uVar9 == 0) {
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"-","");
  }
  else {
    cVar5 = '\x01';
    if (9 < uVar9) {
      uVar7 = uVar9;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar7 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_0012e0f9;
        }
        if (uVar7 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_0012e0f9;
        }
        if (uVar7 < 10000) goto LAB_0012e0f9;
        bVar12 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar12);
      cVar5 = cVar5 + '\x01';
    }
LAB_0012e0f9:
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_b0,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_b0._M_dataplus._M_p,(uint)local_b0._M_string_length,uVar9);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_b0);
  PvrLegacyInfo::PrintFlagNames_abi_cxx11_
            (&local_70,(PvrLegacyInfo *)(ulong)(this->impl_v1_).pixel_format_flags,flags);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_70);
  paVar3 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  uVar9 = (this->impl_v1_).data_size;
  cVar5 = '\x01';
  if (9 < uVar9) {
    uVar7 = uVar9;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar7 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0012e1a7;
      }
      if (uVar7 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0012e1a7;
      }
      if (uVar7 < 10000) goto LAB_0012e1a7;
      bVar12 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar12);
    cVar5 = cVar5 + '\x01';
  }
LAB_0012e1a7:
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p,(uint)local_70._M_string_length,uVar9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> ToStringArray() {
      std::vector<std::string> output;
      const auto& impl_v1(this->impl_v1_);
      const auto& impl_v2(this->impl_v2_);
      const std::uint32_t pixel_format(impl_v1.pixel_format_flags&PvrLegacyInfo::kPixelTypeMask);
      const std::string pixel_format_string(PvrLegacyInfo::pixel_format_names.find(pixel_format)->second);
      output.push_back(pixel_format_string);
      output.push_back(std::to_string(impl_v1.bit_count));
      output.push_back(std::to_string(impl_v1.width));
      output.push_back(std::to_string(impl_v1.height));
      const std::string num_surfaces_string(
        impl_v2.num_surfaces == 0?std::string("-"):std::to_string(impl_v2.num_surfaces));
      output.push_back(num_surfaces_string);
      output.push_back(std::to_string(impl_v1.mip_map_count+1));
      output.push_back(impl_v1.red_mask==0?"False":"True");
      output.push_back(impl_v1.green_mask==0?"False":"True");
      output.push_back(impl_v1.blue_mask==0?"False":"True");
      output.push_back(impl_v1.alpha_mask==0?"False":"True");
      const std::string magic_number_string(
        impl_v2.magic_number == 0?std::string("-"):std::to_string(impl_v2.magic_number));
      output.push_back(magic_number_string);
      output.push_back(PvrLegacyInfo::PrintFlagNames(impl_v1.pixel_format_flags));
      output.push_back(std::to_string(impl_v1.data_size));
      return output;
    }